

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger string_split(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  long lVar2;
  int iVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  long lVar6;
  SQChar *pSVar7;
  long lVar8;
  long lVar9;
  SQObject local_80;
  HSQUIRRELVM local_70;
  SQTable *local_68;
  SQChar *str;
  size_t local_58;
  SQInteger len;
  char *local_48;
  SQInteger sep_len;
  SQChar *sep;
  
  sq_getstringandsize(v,1,&str,&len);
  local_68 = (SQTable *)SQArray::Create(v->_sharedstate,0);
  SVar4 = sq_gettop(v);
  local_70 = v;
  if (SVar4 == 1) {
    lVar6 = 0;
    do {
      SVar4 = len;
      pSVar7 = str;
      lVar8 = lVar6 - len;
      lVar9 = 0;
      while( true ) {
        if (SVar4 < lVar6 + lVar9) goto LAB_0011e95e;
        if ((lVar8 + lVar9 == 0) || (iVar3 = isspace((int)pSVar7[lVar9 + lVar6]), iVar3 != 0))
        break;
        lVar9 = lVar9 + 1;
      }
      if (lVar6 < lVar6 + lVar9) {
        local_80._unVal.pString = SQString::Create(local_70->_sharedstate,str + lVar6,lVar9);
        local_80._type = OT_STRING;
        local_80._flags = '\0';
        pSVar1 = &((local_80._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        SQArray::Append((SQArray *)local_68,&local_80);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_80);
      }
      lVar6 = lVar6 + lVar9 + 1;
    } while( true );
  }
  sq_getstringandsize(v,2,&sep,&sep_len);
  local_58 = sep_len;
  if (sep_len < 1) {
    SVar5 = sq_throwerror(v,"empty separator");
    return SVar5;
  }
  lVar6 = 0;
LAB_0011e853:
  SVar4 = len;
  lVar8 = len - sep_len;
  local_48 = sep;
  pSVar7 = str + lVar6;
  lVar9 = 0;
  local_58 = sep_len;
  do {
    lVar2 = lVar6 + lVar9;
    if (SVar4 < lVar2) {
LAB_0011e95e:
      local_80._type = OT_ARRAY;
      local_80._flags = '\0';
      local_80._unVal.pTable = local_68;
      pSVar1 = &(local_68->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(local_70,(SQObjectPtr *)&local_80);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_80);
      return 1;
    }
    if (lVar8 < lVar2) {
      local_80._unVal.pString = SQString::Create(local_70->_sharedstate,str + lVar6,SVar4 - lVar6);
      local_80._type = OT_STRING;
      local_80._flags = '\0';
      pSVar1 = &((local_80._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQArray::Append((SQArray *)local_68,&local_80);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_80);
      goto LAB_0011e95e;
    }
    iVar3 = strncmp(pSVar7 + lVar9,local_48,local_58);
    if (iVar3 == 0) break;
    lVar9 = lVar9 + 1;
  } while( true );
  local_80._unVal.pString = SQString::Create(local_70->_sharedstate,pSVar7,lVar9);
  local_80._type = OT_STRING;
  local_80._flags = '\0';
  pSVar1 = &((local_80._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
            _uiRef;
  *pSVar1 = *pSVar1 + 1;
  SQArray::Append((SQArray *)local_68,&local_80);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_80);
  lVar6 = lVar2 + sep_len;
  goto LAB_0011e853;
}

Assistant:

static SQInteger string_split(HSQUIRRELVM v)
{
    const SQChar *str;
    SQInteger len;
    sq_getstringandsize(v, 1, &str, &len);

    SQArray *res = SQArray::Create(_ss(v),0);

    if (sq_gettop(v) == 1) {
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len; ++pos) {
            if (pos==len || isspace(str[pos])) {
                if (pos > start)
                    res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                start = pos+1;
            }
        }
    } else {
        const SQChar *sep;
        SQInteger sep_len;
        sq_getstringandsize(v, 2, &sep, &sep_len);
        if (sep_len < 1)
            return sq_throwerror(v, _SC("empty separator"));
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len;) {
            if (pos>len-sep_len) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, len-start)));
                break;
            }
            else if (strncmp(str+pos, sep, sep_len)==0) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                pos += sep_len;
                start = pos;
            }
            else
                ++pos;
        }
    }
    v->Push(res);
    return 1;
}